

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_tap_printer.hpp
# Opt level: O3

void __thiscall
iutest::TAPFileGeneratorListener::TAPFileGeneratorListener
          (TAPFileGeneratorListener *this,char *directory)

{
  (this->super_TAPPrintListener).super_EmptyTestEventListener.super_TestEventListener.
  _vptr_TestEventListener = (_func_int **)&PTR__TAPFileGeneratorListener_00133318;
  (this->m_output_path)._M_dataplus._M_p = (pointer)&(this->m_output_path).field_2;
  (this->m_output_path)._M_string_length = 0;
  (this->m_output_path).field_2._M_local_buf[0] = '\0';
  SetFilePath(this,directory);
  return;
}

Assistant:

explicit TAPFileGeneratorListener(const char* directory=NULL)
    {
        SetFilePath(directory);
    }